

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<double> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  float_specs fVar1;
  byte bVar2;
  int iVar3;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar4;
  appender aVar5;
  undefined8 uVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  int iVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  uint uVar14;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  significand_type significand;
  anon_class_40_8_dbbf3351 write;
  int num_zeros;
  undefined1 local_d7 [2];
  undefined1 local_d5 [13];
  int local_c8;
  int local_c4;
  float_specs local_c0;
  undefined1 local_b8 [20];
  undefined1 auStack_a4 [20];
  float_specs *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_c0 = (float_specs)f->significand;
  lVar8 = 0x3f;
  if (((ulong)local_c0 | 1) != 0) {
    for (; ((ulong)local_c0 | 1) >> lVar8 == 0; lVar8 = lVar8 + -1) {
    }
  }
  local_d5._9_4_ = fspecs._4_4_;
  local_c8 = (uint)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar8] -
             (uint)((ulong)local_c0 <
                   (ulong)*(float_specs *)
                           (do_count_digits(unsigned_long)::zero_or_powers_of_10 +
                           (ulong)(byte)do_count_digits(unsigned_long)::bsr2log10[lVar8] * 8));
  local_d5[0] = '0';
  local_d7[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if (-1 < local_c8) {
    uVar14 = (local_c8 + 1) - (uint)(local_d7[1] == '\0');
    uVar12 = (ulong)uVar14;
    local_d7[0] = '.';
    uVar11 = (uint)local_d5._9_4_ >> 0x11;
    local_d5._5_8_ = fspecs;
    if ((uVar11 & 1) != 0) {
      local_d7[0] = decimal_point_impl<char>(loc);
    }
    uVar6 = auStack_a4._4_8_;
    iVar9 = f->exponent;
    local_c4 = local_c8 + iVar9;
    if (SUB81(local_d5._5_8_,4) == '\x01') {
LAB_001f293c:
      iVar9 = local_c8 + iVar9 + -1;
      if (((uint)local_d5._9_4_ >> 0x13 & 1) == 0) {
        iVar3 = 0;
        if (local_c8 == 1) {
          local_d7[0] = '\0';
          iVar3 = 0;
        }
      }
      else {
        iVar3 = 0;
        if (0 < local_d5._5_4_ - local_c8) {
          iVar3 = local_d5._5_4_ - local_c8;
        }
        uVar12 = (ulong)(uVar14 + iVar3);
      }
      local_b8[0] = local_d7[1];
      local_b8._8_8_ = local_c0;
      auStack_a4[0] = local_d7[0];
      local_b8._16_4_ = local_c8;
      auStack_a4._4_5_ = CONCAT14('0',iVar3);
      auStack_a4._10_2_ = SUB82(uVar6,6);
      auStack_a4._4_8_ =
           CONCAT26(auStack_a4._10_2_,
                    CONCAT15((((uint)local_d5._9_4_ >> 0x10 & 1) == 0) << 5,auStack_a4._4_5_)) |
           0x450000000000;
      auStack_a4._12_4_ = iVar9;
      if (0 < specs->width) {
        if (local_c4 < 1) {
          iVar9 = 1 - local_c4;
        }
        lVar8 = 2;
        if (99 < iVar9) {
          lVar8 = (ulong)(999 < iVar9) + 3;
        }
        sVar13 = uVar12 + lVar8 + (3 - (ulong)(local_d7[0] == '\0'));
        aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,sVar13,sVar13,(anon_class_40_8_dbbf3351 *)local_b8);
        return (appender)
               aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar5 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<double>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_40_8_dbbf3351::operator()
                        ((anon_class_40_8_dbbf3351 *)local_b8,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      return (appender)
             aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if ((local_d5._5_8_ & 0xff00000000) == 0) {
      iVar3 = 0x10;
      if (0 < (int)local_d5._5_4_) {
        iVar3 = local_d5._5_4_;
      }
      if ((local_c4 < -3) || (iVar3 < local_c4)) goto LAB_001f293c;
    }
    if (iVar9 < 0) {
      if (local_c4 < 1) {
        iVar3 = -local_c4;
        iVar9 = iVar3;
        if (SBORROW4(local_d5._5_4_,iVar3) != local_d5._5_4_ + local_c4 < 0) {
          iVar9 = local_d5._5_4_;
        }
        if ((int)local_d5._5_4_ < 0) {
          iVar9 = iVar3;
        }
        if (local_c8 != 0) {
          iVar9 = iVar3;
        }
        local_70._M_allocated_capacity._0_4_ = iVar9;
        bVar2 = 1;
        if (local_c8 == 0 && iVar9 == 0) {
          bVar2 = (local_d5[0xb] & 8) >> 3;
        }
        local_d5[1] = bVar2;
        fVar1 = (float_specs)local_d5._5_8_;
        if (-1 < iVar9) {
          sVar13 = ((uint)bVar2 + iVar9 + 1) + uVar12;
          local_b8._0_8_ = local_d7 + 1;
          local_b8._8_8_ = local_d7 + 2;
          unique0x00004e80 = local_d7 + 3;
          auStack_a4._4_8_ = local_d7;
          auStack_a4._12_8_ = &local_70;
          local_90 = &local_c0;
          local_88._M_allocated_capacity = (size_type)&local_c8;
          aVar5 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                            (out,specs,sVar13,sVar13,(anon_class_56_7_162c6e41 *)local_b8);
          return (appender)
                 aVar5.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.
                 container;
        }
        goto LAB_001f2bf0;
      }
      uVar11 = local_d5._5_4_ - local_c8 & (int)(local_d5._9_4_ << 0xc) >> 0x1f;
      local_d5._1_4_ = uVar11;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_b8,loc,
                 (bool)((byte)((uint)local_d5._9_4_ >> 0x11) & 1));
      iVar9 = 0;
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      sVar13 = uVar11 + uVar12;
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_b8._0_8_;
      do {
        iVar3 = 0x7fffffff;
        if (local_90 != (float_specs *)0x0) {
          if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_)) {
            uVar11 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_b8._0_8_ + (long)(int *)local_b8._8_8_))->_M_local_buf[-1];
          }
          else {
            bVar2 = paVar7->_M_local_buf[0];
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_001f2aa8;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar7->_M_local_buf + 1);
            uVar11 = (uint)bVar2;
          }
          iVar9 = iVar9 + uVar11;
          iVar3 = iVar9;
        }
LAB_001f2aa8:
        sVar13 = sVar13 + 1;
      } while (iVar3 < local_c4);
      local_70._M_allocated_capacity = (size_type)(local_d7 + 1);
      local_70._8_8_ = &local_c0;
      local_60._M_allocated_capacity = (size_type)&local_c8;
      local_60._8_8_ = &local_c4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d7;
      local_40._M_allocated_capacity = (size_type)(local_d7 + 3);
      local_40._8_8_ = local_d7 + 2;
      local_48 = (digit_grouping<char> *)local_b8;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,specs,sVar13,sVar13,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_a4._12_8_ != &local_88) {
        operator_delete((void *)auStack_a4._12_8_,(ulong)(local_88._M_allocated_capacity + 1));
      }
      uVar6 = stack0xffffffffffffff58;
      uVar10 = local_b8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
        return (appender)bVar4.container;
      }
    }
    else {
      uVar12 = (ulong)(iVar9 + uVar14);
      local_d5._1_4_ = local_d5._5_4_ - local_c4;
      if (((uint)local_d5._9_4_ >> 0x13 & 1) != 0) {
        if (SUB81(local_d5._5_8_,4) != '\x02' && (int)local_d5._1_4_ < 1) {
          local_d5._1_4_ = 0;
        }
        uVar12 = uVar12 + 1;
        if (0 < (long)(int)local_d5._1_4_) {
          uVar12 = uVar12 + (long)(int)local_d5._1_4_;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,
                 (bool)((byte)((uint)local_d5._9_4_ >> 0x11) & 1));
      sVar13 = uVar12 - 1;
      iVar9 = 0;
      uVar6 = local_70._0_8_;
      do {
        iVar3 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar6 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70._8_8_ + local_70._M_allocated_capacity)) {
            uVar11 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_70._8_8_ + local_70._M_allocated_capacity))->_M_local_buf[-1];
          }
          else {
            bVar2 = *(byte *)uVar6;
            if ((byte)(bVar2 + 0x81) < 0x82) goto LAB_001f2898;
            uVar6 = uVar6 + 1;
            uVar11 = (uint)bVar2;
          }
          iVar9 = iVar9 + uVar11;
          iVar3 = iVar9;
        }
LAB_001f2898:
        sVar13 = sVar13 + 1;
      } while (iVar3 < local_c4);
      local_b8._0_8_ = local_d7 + 1;
      local_b8._8_8_ = &local_c0;
      unique0x00004e80 = &local_c8;
      local_90 = (float_specs *)(local_d7 + 7);
      local_88._M_allocated_capacity = (size_type)local_d7;
      local_88._8_8_ = local_d7 + 3;
      local_78 = local_d7 + 2;
      auStack_a4._4_8_ = f;
      auStack_a4._12_8_ = &local_70;
      bVar4.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<double>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,sVar13,sVar13,(anon_class_72_9_0c6a3a8a *)local_b8);
      if (local_50 != &local_40) {
        operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
      }
      uVar6 = local_60._M_allocated_capacity;
      uVar10 = local_70._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._0_8_ == &local_60) {
        return (appender)bVar4.container;
      }
    }
    operator_delete((void *)uVar10,uVar6 + 1);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar4.container;
  }
LAB_001f2bf0:
  local_d5._5_8_ = fVar1;
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/fmt/include/fmt/core.h"
              ,0x17a,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}